

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::MessageLite::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  bool bVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = AppendToString(this,__return_storage_ptr__);
  if (!bVar1) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

string MessageLite::SerializeAsString() const {
  // If the compiler implements the (Named) Return Value Optimization,
  // the local variable 'output' will not actually reside on the stack
  // of this function, but will be overlaid with the object that the
  // caller supplied for the return value to be constructed in.
  string output;
  if (!AppendToString(&output))
    output.clear();
  return output;
}